

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNStmReturn::gen_code(CTPNStmReturn *this,int param_1,int param_2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uchar opc;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint unaff_EBP;
  CTcPrsNode *pCVar5;
  uchar uStack_40;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar5 = (this->super_CTPNStmReturnBase).expr_;
  if (pCVar5 == (CTcPrsNode *)0x0) {
    bVar1 = true;
    bVar3 = false;
  }
  else {
    if ((G_cg->field_0xd0 & 1) != 0) {
      CTPNStmBase::log_error((CTPNStmBase *)this,0x2e29);
      pCVar5 = (this->super_CTPNStmReturnBase).expr_;
    }
    iVar4 = (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if (CONCAT44(extraout_var,iVar4) != 0) {
      iVar4 = (*(((this->super_CTPNStmReturnBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      bVar3 = true;
      bVar1 = true;
      if (*(int *)CONCAT44(extraout_var_00,iVar4) - 1U < 2) goto LAB_00244541;
    }
    unaff_EBP = G_cg->sp_depth_;
    pCVar5 = (this->super_CTPNStmReturnBase).expr_;
    bVar3 = false;
    (**(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar5,0,0);
    bVar1 = G_cg->sp_depth_ <= (int)unaff_EBP;
  }
LAB_00244541:
  if (G_cs->enclosing_ != (CTPNStmEnclosing *)0x0) {
    bVar2 = true;
    if (((!bVar1) &&
        (iVar4 = (*(G_cs->enclosing_->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.
                   super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x22])(), iVar4 != 0)) &&
       (G_cs->code_body_ != (CTPNCodeBody *)0x0)) {
      unaff_EBP = CTPNCodeBody::alloc_fin_ret_lcl(G_cs->code_body_);
      bVar2 = false;
      CTcSymLocal::s_gen_code_setlcl_stk(unaff_EBP,0);
    }
    (*(G_cs->enclosing_->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x21])();
    if (!bVar2) {
      CTcSymLocal::s_gen_code_getlcl(unaff_EBP,0);
    }
  }
  if ((G_cg->field_0xd0 & 1) != 0) {
    CTcGenTarg::write_op(G_cg,0x84);
    uStack_40 = 'P';
    goto LAB_00244629;
  }
  pCVar5 = (this->super_CTPNStmReturnBase).expr_;
  if (pCVar5 != (CTcPrsNode *)0x0) {
    iVar4 = (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar5);
    if (CONCAT44(extraout_var_01,iVar4) != 0) {
      iVar4 = (*(((this->super_CTPNStmReturnBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      if (*(int *)CONCAT44(extraout_var_02,iVar4) == 1) {
        opc = 'Q';
      }
      else {
        if (*(int *)CONCAT44(extraout_var_02,iVar4) != 2) goto LAB_00244619;
        opc = 'R';
      }
      CTcGenTarg::write_op(G_cg,opc);
    }
LAB_00244619:
    if (bVar3) {
      return;
    }
    if (!bVar1) {
      CTcGenTarg::write_op(G_cg,'P');
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
      return;
    }
  }
  uStack_40 = 'Q';
LAB_00244629:
  CTcGenTarg::write_op(G_cg,uStack_40);
  return;
}

Assistant:

void CTPNStmReturn::gen_code(int, int)
{
    int val_on_stack;
    int need_gen;

    /* add a line record */
    add_debug_line_rec();

    /* presume we'll generate a value */
    need_gen = TRUE;
    val_on_stack = FALSE;

    /* generate the return value expression, if appropriate */
    if (expr_ != 0)
    {
        /* 
         *   it's an error if we're in a constructor, because a
         *   constructor implicitly always returns 'self' 
         */
        if (G_cg->is_in_constructor())
            log_error(TCERR_CONSTRUCT_CANNOT_RET_VAL);

        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
            case TC_CVT_TRUE:
                /* 
                 *   we can use special constant return instructions for
                 *   these, so there's no need to generate the value 
                 */
                need_gen = FALSE;
                break;

            default:
                /* 
                 *   other types don't have constant-return opcodes, so we
                 *   must generate the expression code 
                 */
                need_gen = TRUE;
                break;
            }
        }

        /* if necessary, generate the value */
        if (need_gen)
        {
            int depth;

            /* note the initial stack depth */
            depth = G_cg->get_sp_depth();

            /*  
             *   Generate the value.  We are obviously not discarding the
             *   value, and since returning a value is equivalent to
             *   assigning the value, we must use the stricter assignment
             *   (not 'for condition') rules for logical expressions 
             */
            expr_->gen_code(FALSE, FALSE);

            /* note whether we actually left a value on the stack */
            val_on_stack = (G_cg->get_sp_depth() > depth);
        }
        else
        {
            /* 
             *   we obviously aren't leaving a value on the stack if we
             *   don't generate anything 
             */
            val_on_stack = FALSE;
        }
    }

    /* 
     *   Before we return, let any enclosing statements generate any code
     *   necessary to leave their scope (in particular, we must invoke
     *   'finally' handlers in any enclosing 'try' blocks).
     *   
     *   Note that we generated the expression BEFORE we call any
     *   'finally' handlers.  This is necessary because something we call
     *   in the course of evaluating the return value could have thrown an
     *   exception; if we were to call the 'finally' clauses before
     *   generating the return value, we could invoke the 'finally' clause
     *   twice (once explicitly, once in the handling of the thrown
     *   exception), which would be incorrect.  By generating the
     *   'finally' calls after the return expression, we're sure that the
     *   'finally' blocks are invoked only once - either through the
     *   throw, or else now, after there's no more possibility of a
     *   'throw' before the return.  
     */
    if (G_cs->get_enclosing() != 0)
    {
        int did_save_retval;
        uint fin_ret_lcl;

        /* 
         *   if we're going to generate any subroutine calls, and we have
         *   a return value on the stack, we need to save the return value
         *   in a local to make sure the calculated value isn't affected
         *   by the subroutine call 
         */
        if (val_on_stack
            && G_cs->get_enclosing()->will_gen_code_unwind_for_return()
            && G_cs->get_code_body() != 0)
        {
            /* allocate a local variable to save the return value */
            fin_ret_lcl = G_cs->get_code_body()->alloc_fin_ret_lcl();

            /* save the return value in a stack temporary for a moment */
            CTcSymLocal::s_gen_code_setlcl_stk(fin_ret_lcl, FALSE);

            /* 
             *   note that we saved the return value, so we can retrieve
             *   it later 
             */
            did_save_retval = TRUE;
        }
        else
        {
            /* note that we didn't save the return value */
            did_save_retval = FALSE;
        }

        /* generate the unwind */
        G_cs->get_enclosing()->gen_code_unwind_for_return();

        /* if we saved the return value, retrieve it */
        if (did_save_retval)
            CTcSymLocal::s_gen_code_getlcl(fin_ret_lcl, FALSE);
    }

    /* check for an expression to return */
    if (G_cg->is_in_constructor())
    {
        /* we're in a constructor - return 'self' */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_RETVAL);
    }
    else if (expr_ == 0)
    {
        /* 
         *   there's no expression - generate a simple void return (but
         *   explicitly return nil, so we don't return something left in
         *   R0 from a previous function call we made) 
         */
        G_cg->write_op(OPC_RETNIL);
    }
    else
    {
        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
                /* generate a RETNIL instruction */
                G_cg->write_op(OPC_RETNIL);
                break;

            case TC_CVT_TRUE:
                /* generate a RETTRUE instruction */
                G_cg->write_op(OPC_RETTRUE);
                break;

            default:
                break;
            }
        }

        /* 
         *   if we needed code generation to evaluate the return value, we
         *   now need to return the value 
         */
        if (need_gen)
        {
            /* 
             *   Other types don't have constant-return opcodes.  We
             *   already generated the expression value (before invoking
             *   the enclosing 'finally' handlers, if any), so the value
             *   is on the stack, and all we need to do is return it.
             *   
             *   If we didn't actually leave a value on the stack, we'll
             *   just return nil.  
             */
            if (val_on_stack)
            {
                /* generate the return-value opcode */
                G_cg->write_op(OPC_RETVAL);
                
                /* RETVAL removes an element from the stack */
                G_cg->note_pop();
            }
            else
            {
                /* 
                 *   The depth didn't change - they must have evaluated an
                 *   expression involving a dstring or void function.
                 *   Return nil instead of the non-existent value.  
                 */
                G_cg->write_op(OPC_RETNIL);
            }
        }
    }
}